

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  cmMakefile *pcVar4;
  cmLocalNinjaGenerator *pcVar5;
  pointer pcVar6;
  TargetType targetType;
  int iVar7;
  string *psVar8;
  cmGlobalNinjaGenerator *pcVar9;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string compileCmd;
  string flags;
  cmNinjaRule rule;
  RuleVariables vars;
  allocator_type local_3b1;
  undefined1 local_3b0 [32];
  string local_390;
  cmRulePlaceholderExpander *local_370;
  undefined1 local_368 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined1 local_328 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  cmMakefile *local_2e8;
  string local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  undefined1 local_2a8 [32];
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  char *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  char *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  bool local_188;
  undefined1 local_180 [24];
  char *local_168;
  char *local_150;
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  char *local_c0;
  char *local_48;
  char *local_40;
  
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  LanguageLinkerCudaDeviceRule(&local_2e0,this,config);
  local_2a8._0_8_ = local_2a8 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p == &local_2e0.field_2) {
    local_2a8._24_4_ = local_2e0.field_2._8_4_;
    local_2a8._28_4_ = local_2e0.field_2._12_4_;
  }
  else {
    local_2a8._0_8_ = local_2e0._M_dataplus._M_p;
  }
  local_288._M_p = (pointer)&local_278;
  local_2a8._8_8_ = local_2e0._M_string_length;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_allocated_capacity._0_4_ =
       local_2e0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_268._M_p = (pointer)&local_258;
  local_260 = (char *)0x0;
  local_258._M_local_buf[0] = '\0';
  local_248._M_p = (pointer)&local_238;
  local_240 = (char *)0x0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188 = false;
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  paVar1 = &local_390.field_2;
  local_390._M_dataplus._M_p = (pointer)paVar1;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"CMAKE_CUDA_DEVICE_LINKER","");
  psVar8 = cmMakefile::GetRequiredDefinition(pcVar4,&local_390);
  local_180._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_180._0_8_ = psVar8->_M_string_length;
  local_180._16_8_ = 0x22;
  local_168 = " -arch=$ARCH $REGISTER -o=$out $in";
  views._M_len = 2;
  views._M_array = (iterator)local_180;
  cmCatViews_abi_cxx11_((string *)&local_348,views);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_348;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_368,__l,(allocator_type *)local_308._M_local_buf);
  local_180._8_8_ = (char *)0x0;
  local_180._16_8_ = local_180._16_8_ & 0xffffffffffffff00;
  local_2e8 = pcVar4;
  local_180._0_8_ = local_180 + 0x10;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_3b0,pcVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_368,config,config,(string *)local_180,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_3b0);
  pcVar2 = local_3b0 + 0x10;
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_allocated_capacity != &local_338) {
    operator_delete((void *)local_348._M_allocated_capacity,local_338._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_248,0,local_240,0x7803f3);
  std::__cxx11::string::_M_replace((ulong)&local_268,0,local_260,0x780411);
  pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_2a8);
  memset(local_180,0,0x150);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  local_180._0_8_ = (psVar8->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  local_180._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_150 = "CUDA";
  local_100 = "$out";
  local_48 = "$FATBIN";
  local_40 = "$REGISTER";
  local_c0 = "$LINK_FLAGS";
  local_3b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"CUDA","");
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_390._M_dataplus._M_p = (pointer)paVar1;
  cmCommonTargetGenerator::GetFlags
            ((string *)&local_348,(cmCommonTargetGenerator *)this,(string *)local_3b0,config,
             &local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_348._M_allocated_capacity;
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  local_3b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,"CMAKE_CUDA_DEVICE_LINK_COMPILE","");
  psVar8 = cmMakefile::GetRequiredDefinition(pcVar4,(string *)local_3b0);
  pcVar6 = (psVar8->_M_dataplus)._M_p;
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390,pcVar6,pcVar6 + psVar8->_M_string_length);
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  iVar7 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
            super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  local_370 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar7);
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar5 == (cmLocalNinjaGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmRulePlaceholderExpander::ExpandRuleVariables
            (local_370,outputConverter,&local_390,(RuleVariables *)local_180);
  LanguageLinkerCudaDeviceCompileRule((string *)local_3b0,this,config);
  std::__cxx11::string::operator=((string *)local_2a8,(string *)local_3b0);
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pbVar3 = (pointer)(local_368 + 0x10);
  local_368._0_8_ = pbVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,local_390._M_dataplus._M_p,
             local_390._M_dataplus._M_p + local_390._M_string_length);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_368;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_328,__l_00,(allocator_type *)&local_2c0);
  local_308._8_8_ = 0;
  local_2f8._M_local_buf[0] = '\0';
  local_308._M_allocated_capacity = (size_type)&local_2f8;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_3b0,pcVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_328,config,config,(string *)&local_308,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_3b0);
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_allocated_capacity != &local_2f8) {
    operator_delete((void *)local_308._M_allocated_capacity,
                    CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_328);
  if ((pointer)local_368._0_8_ != pbVar3) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&local_248,0,local_240,0x780454);
  std::__cxx11::string::_M_replace((ulong)&local_268,0,local_260,0x78047a);
  pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_2a8);
  LanguageLinkerCudaFatbinaryRule((string *)local_3b0,this,config);
  std::__cxx11::string::operator=((string *)local_2a8,(string *)local_3b0);
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_328._0_8_ = local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"CMAKE_CUDA_FATBINARY","");
  psVar8 = cmMakefile::GetRequiredDefinition(local_2e8,(string *)local_328);
  local_3b0._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_3b0._0_8_ = psVar8->_M_string_length;
  local_3b0._16_8_ = 0x51;
  local_3b0._24_8_ =
       " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES";
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_3b0;
  cmCatViews_abi_cxx11_((string *)&local_308,views_00);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_308;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c0,__l_01,&local_3b1);
  local_3b0._8_8_ = (char *)0x0;
  local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
  local_3b0._0_8_ = pcVar2;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_368,pcVar5,&local_2c0,config,config,(string *)local_3b0,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_368);
  if ((pointer)local_368._0_8_ != pbVar3) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
  }
  if ((pointer)local_3b0._0_8_ != pcVar2) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_allocated_capacity != &local_2f8) {
    operator_delete((void *)local_308._M_allocated_capacity,
                    CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&local_248,0,local_240,0x780501);
  std::__cxx11::string::_M_replace((ulong)&local_268,0,local_260,0x78051c);
  pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_2a8);
  (*(local_370->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_allocated_capacity != &local_338) {
    operator_delete((void *)local_348._M_allocated_capacity,local_338._M_allocated_capacity + 1);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_2a8);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}